

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O1

void ZSTD_rescaleFreqs(optState_t *optPtr,BYTE *src,size_t srcSize,int optLevel)

{
  short sVar1;
  ZSTD_literalCompressionMode_e ZVar2;
  uint *puVar3;
  ZSTD_entropyCTables_t *pZVar4;
  undefined8 in_RAX;
  long lVar5;
  U32 UVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint lit;
  undefined8 uStack_28;
  
  ZVar2 = optPtr->literalCompressionMode;
  optPtr->priceType = zop_dynamic;
  uStack_28 = in_RAX;
  if (optPtr->litLengthSum == 0) {
    if (srcSize < 0x401) {
      optPtr->priceType = zop_predef;
    }
    if ((optPtr->symbolCosts->huf).repeatMode == HUF_repeat_valid) {
      optPtr->priceType = zop_dynamic;
      if (ZVar2 != ZSTD_lcm_uncompressed) {
        optPtr->litSum = 0;
        lVar5 = 0;
        do {
          UVar6 = HUF_getNbBits(optPtr->symbolCosts,(U32)lVar5);
          uVar7 = 1 << (0xbU - (char)UVar6 & 0x1f);
          if (UVar6 == 0) {
            uVar7 = 1;
          }
          optPtr->litFreq[lVar5] = uVar7;
          optPtr->litSum = optPtr->litSum + uVar7;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x100);
      }
      puVar3 = optPtr->litLengthFreq;
      pZVar4 = optPtr->symbolCosts;
      sVar1 = (short)(pZVar4->fse).litlengthCTable[0];
      lVar5 = 1;
      if (sVar1 != 0) {
        lVar5 = (long)(1 << ((char)sVar1 - 1U & 0x1f));
      }
      optPtr->litLengthSum = 0;
      lVar8 = 0;
      do {
        uVar7 = (pZVar4->fse).litlengthCTable[lVar5 + lVar8 * 2 + 2] + 0xffff;
        uVar9 = 1 << (10U - (char)(uVar7 >> 0x10) & 0x1f);
        if (uVar7 < 0x10000) {
          uVar9 = 1;
        }
        puVar3[lVar8] = uVar9;
        optPtr->litLengthSum = optPtr->litLengthSum + uVar9;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x24);
      sVar1 = (short)(pZVar4->fse).matchlengthCTable[0];
      lVar5 = 1;
      if (sVar1 != 0) {
        lVar5 = (long)(1 << ((char)sVar1 - 1U & 0x1f));
      }
      optPtr->matchLengthSum = 0;
      puVar3 = optPtr->matchLengthFreq;
      lVar8 = 0;
      do {
        uVar7 = (pZVar4->fse).matchlengthCTable[lVar5 + lVar8 * 2 + 2] + 0xffff;
        uVar9 = 1 << (10U - (char)(uVar7 >> 0x10) & 0x1f);
        if (uVar7 < 0x10000) {
          uVar9 = 1;
        }
        puVar3[lVar8] = uVar9;
        optPtr->matchLengthSum = optPtr->matchLengthSum + uVar9;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x35);
      sVar1 = (short)(pZVar4->fse).offcodeCTable[0];
      lVar5 = 1;
      if (sVar1 != 0) {
        lVar5 = (long)(1 << ((char)sVar1 - 1U & 0x1f));
      }
      optPtr->offCodeSum = 0;
      puVar3 = optPtr->offCodeFreq;
      lVar8 = 0;
      do {
        uVar7 = (pZVar4->fse).offcodeCTable[lVar5 + lVar8 * 2 + 2] + 0xffff;
        uVar9 = 1 << (10U - (char)(uVar7 >> 0x10) & 0x1f);
        if (uVar7 < 0x10000) {
          uVar9 = 1;
        }
        puVar3[lVar8] = uVar9;
        optPtr->offCodeSum = optPtr->offCodeSum + uVar9;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x20);
      goto LAB_00137aa9;
    }
    if (ZVar2 != ZSTD_lcm_uncompressed) {
      uStack_28 = CONCAT44(0xff,(int)in_RAX);
      HIST_count_simple(optPtr->litFreq,(uint *)((long)&uStack_28 + 4),src,srcSize);
      puVar3 = optPtr->litFreq;
      lVar5 = 0;
      UVar6 = 0;
      do {
        uVar7 = puVar3[lVar5] >> 5;
        puVar3[lVar5] = uVar7 + 1;
        UVar6 = UVar6 + uVar7 + 1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x100);
      optPtr->litSum = UVar6;
    }
    puVar3 = optPtr->litLengthFreq;
    lVar5 = 0;
    do {
      puVar3[lVar5] = 1;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x24);
    optPtr->litLengthSum = 0x24;
    puVar3 = optPtr->matchLengthFreq;
    lVar5 = 0;
    do {
      puVar3[lVar5] = 1;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x35);
    optPtr->matchLengthSum = 0x35;
    puVar3 = optPtr->offCodeFreq;
    lVar5 = 0;
    do {
      puVar3[lVar5] = 1;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x20);
    UVar6 = 0x20;
  }
  else {
    if (ZVar2 != ZSTD_lcm_uncompressed) {
      puVar3 = optPtr->litFreq;
      lVar5 = 0;
      UVar6 = 0;
      do {
        uVar7 = puVar3[lVar5] >> 5;
        puVar3[lVar5] = uVar7 + 1;
        UVar6 = UVar6 + uVar7 + 1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x100);
      optPtr->litSum = UVar6;
    }
    puVar3 = optPtr->litLengthFreq;
    lVar5 = 0;
    UVar6 = 0;
    do {
      uVar7 = puVar3[lVar5] >> 4;
      puVar3[lVar5] = uVar7 + 1;
      UVar6 = UVar6 + uVar7 + 1;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x24);
    optPtr->litLengthSum = UVar6;
    puVar3 = optPtr->matchLengthFreq;
    lVar5 = 0;
    UVar6 = 0;
    do {
      uVar7 = puVar3[lVar5] >> 4;
      puVar3[lVar5] = uVar7 + 1;
      UVar6 = UVar6 + uVar7 + 1;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x35);
    optPtr->matchLengthSum = UVar6;
    puVar3 = optPtr->offCodeFreq;
    lVar5 = 0;
    UVar6 = 0;
    do {
      uVar7 = puVar3[lVar5] >> 4;
      puVar3[lVar5] = uVar7 + 1;
      UVar6 = UVar6 + uVar7 + 1;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x20);
  }
  optPtr->offCodeSum = UVar6;
LAB_00137aa9:
  ZSTD_setBasePrices(optPtr,optLevel);
  return;
}

Assistant:

static void
ZSTD_rescaleFreqs(optState_t* const optPtr,
            const BYTE* const src, size_t const srcSize,
                  int const optLevel)
{
    int const compressedLiterals = ZSTD_compressedLiterals(optPtr);
    DEBUGLOG(5, "ZSTD_rescaleFreqs (srcSize=%u)", (unsigned)srcSize);
    optPtr->priceType = zop_dynamic;

    if (optPtr->litLengthSum == 0) {  /* first block : init */
        if (srcSize <= ZSTD_PREDEF_THRESHOLD) {  /* heuristic */
            DEBUGLOG(5, "(srcSize <= ZSTD_PREDEF_THRESHOLD) => zop_predef");
            optPtr->priceType = zop_predef;
        }

        assert(optPtr->symbolCosts != NULL);
        if (optPtr->symbolCosts->huf.repeatMode == HUF_repeat_valid) {
            /* huffman table presumed generated by dictionary */
            optPtr->priceType = zop_dynamic;

            if (compressedLiterals) {
                unsigned lit;
                assert(optPtr->litFreq != NULL);
                optPtr->litSum = 0;
                for (lit=0; lit<=MaxLit; lit++) {
                    U32 const scaleLog = 11;   /* scale to 2K */
                    U32 const bitCost = HUF_getNbBits(optPtr->symbolCosts->huf.CTable, lit);
                    assert(bitCost <= scaleLog);
                    optPtr->litFreq[lit] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litSum += optPtr->litFreq[lit];
            }   }

            {   unsigned ll;
                FSE_CState_t llstate;
                FSE_initCState(&llstate, optPtr->symbolCosts->fse.litlengthCTable);
                optPtr->litLengthSum = 0;
                for (ll=0; ll<=MaxLL; ll++) {
                    U32 const scaleLog = 10;   /* scale to 1K */
                    U32 const bitCost = FSE_getMaxNbBits(llstate.symbolTT, ll);
                    assert(bitCost < scaleLog);
                    optPtr->litLengthFreq[ll] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litLengthSum += optPtr->litLengthFreq[ll];
            }   }

            {   unsigned ml;
                FSE_CState_t mlstate;
                FSE_initCState(&mlstate, optPtr->symbolCosts->fse.matchlengthCTable);
                optPtr->matchLengthSum = 0;
                for (ml=0; ml<=MaxML; ml++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(mlstate.symbolTT, ml);
                    assert(bitCost < scaleLog);
                    optPtr->matchLengthFreq[ml] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->matchLengthSum += optPtr->matchLengthFreq[ml];
            }   }

            {   unsigned of;
                FSE_CState_t ofstate;
                FSE_initCState(&ofstate, optPtr->symbolCosts->fse.offcodeCTable);
                optPtr->offCodeSum = 0;
                for (of=0; of<=MaxOff; of++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(ofstate.symbolTT, of);
                    assert(bitCost < scaleLog);
                    optPtr->offCodeFreq[of] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->offCodeSum += optPtr->offCodeFreq[of];
            }   }

        } else {  /* not a dictionary */

            assert(optPtr->litFreq != NULL);
            if (compressedLiterals) {
                unsigned lit = MaxLit;
                HIST_count_simple(optPtr->litFreq, &lit, src, srcSize);   /* use raw first block to init statistics */
                optPtr->litSum = ZSTD_downscaleStat(optPtr->litFreq, MaxLit, 1);
            }

            {   unsigned ll;
                for (ll=0; ll<=MaxLL; ll++)
                    optPtr->litLengthFreq[ll] = 1;
            }
            optPtr->litLengthSum = MaxLL+1;

            {   unsigned ml;
                for (ml=0; ml<=MaxML; ml++)
                    optPtr->matchLengthFreq[ml] = 1;
            }
            optPtr->matchLengthSum = MaxML+1;

            {   unsigned of;
                for (of=0; of<=MaxOff; of++)
                    optPtr->offCodeFreq[of] = 1;
            }
            optPtr->offCodeSum = MaxOff+1;

        }

    } else {   /* new block : re-use previous statistics, scaled down */

        if (compressedLiterals)
            optPtr->litSum = ZSTD_downscaleStat(optPtr->litFreq, MaxLit, 1);
        optPtr->litLengthSum = ZSTD_downscaleStat(optPtr->litLengthFreq, MaxLL, 0);
        optPtr->matchLengthSum = ZSTD_downscaleStat(optPtr->matchLengthFreq, MaxML, 0);
        optPtr->offCodeSum = ZSTD_downscaleStat(optPtr->offCodeFreq, MaxOff, 0);
    }

    ZSTD_setBasePrices(optPtr, optLevel);
}